

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_object.c
# Opt level: O1

int object_decrement_reference(object obj)

{
  atomic_uintmax_t aVar1;
  int iVar2;
  
  iVar2 = 1;
  if ((obj != (object)0x0) && (aVar1 = (obj->ref).count, aVar1 != 0)) {
    LOCK();
    (obj->ref).count = (obj->ref).count - 1;
    UNLOCK();
    if (aVar1 != 0) {
      LOCK();
      object_stats.decrements = object_stats.decrements + 1;
      UNLOCK();
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int object_decrement_reference(object obj)
{
	if (obj == NULL)
	{
		return 1;
	}

	if (threading_atomic_ref_count_decrement(&obj->ref) == 1)
	{
		return 1;
	}

	reflect_memory_tracker_decrement(object_stats);

	return 0;
}